

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O2

string * __thiscall
project::get_linux_config_abi_cxx11_(string *__return_storage_ptr__,project *this)

{
  undefined8 uVar1;
  ostream *poVar2;
  _List_node_base *p_Var3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *path;
  pointer pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *library;
  pointer pbVar5;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  packages;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  libs;
  buildExport b;
  stringstream ss;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_480;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_468;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_450;
  string local_438;
  undefined1 local_418 [120];
  _Alloc_hider local_3a0;
  size_type local_398;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_390;
  _Alloc_hider local_380;
  size_type local_378;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_370;
  _Alloc_hider local_360;
  size_type local_358;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_350;
  _Alloc_hider local_340;
  size_type local_338;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330;
  _Alloc_hider local_320;
  size_type local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_310;
  _Alloc_hider local_300;
  size_type local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  _Alloc_hider local_2e0;
  size_type local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d0 [2];
  _Alloc_hider local_2b0;
  size_type local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  _Alloc_hider local_288;
  size_type local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  pointer local_268;
  pointer pbStack_260;
  pointer local_258;
  pointer pbStack_250;
  pointer local_248;
  pointer pbStack_240;
  _Alloc_hider local_230;
  size_type local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  _Alloc_hider local_208;
  size_type local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  pointer local_1e8;
  pointer pbStack_1e0;
  pointer local_1d8;
  pointer pbStack_1d0;
  pointer local_1c8;
  pointer pbStack_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_418._8_8_ = local_418 + 0x18;
  local_418._16_8_ = 0;
  local_418[0x18] = '\0';
  local_418._88_8_ = local_418 + 0x68;
  local_418._40_8_ = (pointer)0x0;
  local_418._48_8_ = (pointer)0x0;
  local_418._56_8_ = (pointer)0x0;
  local_418._64_8_ = (pointer)0x0;
  local_418._72_8_ = (pointer)0x0;
  local_418._80_8_ = (pointer)0x0;
  local_418._96_8_ = 0;
  local_418[0x68] = '\0';
  local_3a0._M_p = (pointer)&local_390;
  local_398 = 0;
  local_390._M_local_buf[0] = '\0';
  local_380._M_p = (pointer)&local_370;
  local_378 = 0;
  local_370._M_local_buf[0] = '\0';
  local_360._M_p = (pointer)&local_350;
  local_358 = 0;
  local_350._M_local_buf[0] = '\0';
  local_340._M_p = (pointer)&local_330;
  local_338 = 0;
  local_330._M_local_buf[0] = '\0';
  local_320._M_p = (pointer)&local_310;
  local_318 = 0;
  local_310._M_local_buf[0] = '\0';
  local_300._M_p = (pointer)&local_2f0;
  local_2f8 = 0;
  local_2f0._M_local_buf[0] = '\0';
  local_2e0._M_p = (pointer)local_2d0;
  local_2d8 = 0;
  local_2d0[0]._M_local_buf[0] = '\0';
  local_2b0._M_p = (pointer)&local_2a0;
  local_2a8 = 0;
  local_2a0._M_local_buf[0] = '\0';
  local_288._M_p = (pointer)&local_278;
  local_280 = 0;
  local_278._M_local_buf[0] = '\0';
  local_248 = (pointer)0x0;
  pbStack_240 = (pointer)0x0;
  local_258 = (pointer)0x0;
  pbStack_250 = (pointer)0x0;
  local_268 = (pointer)0x0;
  pbStack_260 = (pointer)0x0;
  local_230._M_p = (pointer)&local_220;
  local_228 = 0;
  local_220._M_local_buf[0] = '\0';
  local_208._M_p = (pointer)&local_1f8;
  local_200 = 0;
  local_1f8._M_local_buf[0] = '\0';
  local_1e8 = (pointer)0x0;
  pbStack_1e0 = (pointer)0x0;
  local_1d8 = (pointer)0x0;
  pbStack_1d0 = (pointer)0x0;
  local_1c8 = (pointer)0x0;
  pbStack_1c0 = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_438,"LINUX_MAKE",(allocator *)&local_480);
  get_export(this,&local_438,(buildExport *)local_418);
  std::__cxx11::string::~string((string *)&local_438);
  if (local_418[0] == false) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_480);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Using Linux Config");
    std::endl<char,std::char_traits<char>>(poVar2);
    get_libraries((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_480,this,&linuxPackages_abi_cxx11_);
    p_Var3 = (_List_node_base *)&local_480;
    if (local_480._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_480) {
      std::operator<<(local_1a8,"\n");
      std::operator<<(local_1a8,"        include(FindPkgConfig)\n");
      std::operator<<(local_1a8,"        pkg_check_modules(JUCE_LIBS REQUIRED\n");
      std::operator<<(local_1a8,"            ");
      p_Var3 = (_List_node_base *)&local_480;
      while (p_Var3 = (((_List_impl *)&p_Var3->_M_next)->_M_node).super__List_node_base._M_next,
            p_Var3 != (_List_node_base *)&local_480) {
        poVar2 = std::operator<<(local_1a8,(string *)(p_Var3 + 1));
        std::operator<<(poVar2," ");
      }
      std::operator<<(local_1a8,"\n)\n");
      p_Var3 = local_480._M_impl._M_node.super__List_node_base._M_next;
    }
    if ((local_268 != pbStack_260) || (p_Var3 != (_List_node_base *)&local_480)) {
      std::operator<<(local_1a8,"\n");
      poVar2 = std::operator<<(local_1a8,"        target_include_directories(");
      poVar2 = std::operator<<(poVar2,(string *)&this->name);
      std::operator<<(poVar2," PUBLIC\n");
      pbVar4 = local_268;
      pbVar5 = pbStack_260;
      if (local_480._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_480)
      {
        std::operator<<(local_1a8,"            ${JUCE_LIBS_INCLUDE_DIRS}\n");
        pbVar4 = local_268;
        pbVar5 = pbStack_260;
      }
      for (; pbVar4 != pbVar5; pbVar4 = pbVar4 + 1) {
        poVar2 = std::operator<<(local_1a8,"            ${CMAKE_SYSROOT}/");
        poVar2 = std::operator<<(poVar2,(string *)pbVar4);
        std::operator<<(poVar2,"\n");
      }
      std::operator<<(local_1a8,"        )\n");
    }
    if (local_398 != 0) {
      std::operator<<(local_1a8,"\n");
      poVar2 = std::operator<<(local_1a8,"        target_compile_options(");
      poVar2 = std::operator<<(poVar2,(string *)&this->name);
      poVar2 = std::operator<<(poVar2," PUBLIC ");
      poVar2 = std::operator<<(poVar2,(string *)&local_3a0);
      std::operator<<(poVar2,")\n");
    }
    if (pbStack_250 != local_248) {
      std::operator<<(local_1a8,"\n");
      poVar2 = std::operator<<(local_1a8,"        target_link_directories(");
      poVar2 = std::operator<<(poVar2,(string *)&this->name);
      std::operator<<(poVar2," BEFORE PUBLIC\n");
      pbVar5 = local_248;
      for (pbVar4 = pbStack_250; pbVar4 != pbVar5; pbVar4 = pbVar4 + 1) {
        poVar2 = std::operator<<(local_1a8,"            ${CMAKE_SYSROOT}/");
        poVar2 = std::operator<<(poVar2,(string *)pbVar4);
        std::operator<<(poVar2,"\n");
      }
      std::operator<<(local_1a8,"        )\n");
    }
    get_libraries((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_468,this,&linuxLibs_abi_cxx11_);
    if (((local_418._64_8_ != local_418._72_8_) ||
        (local_480._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_480))
       || (local_468._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_468)
       ) {
      std::operator<<(local_1a8,"\n");
      poVar2 = std::operator<<(local_1a8,"        target_link_libraries(");
      poVar2 = std::operator<<(poVar2,(string *)&this->name);
      std::operator<<(poVar2,"\n");
      uVar1 = local_418._72_8_;
      for (pbVar5 = (pointer)local_418._64_8_; pbVar5 != (pointer)uVar1; pbVar5 = pbVar5 + 1) {
        poVar2 = std::operator<<(local_1a8,"            ");
        poVar2 = std::operator<<(poVar2,(string *)pbVar5);
        std::operator<<(poVar2,"\n");
      }
      if (local_480._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_480)
      {
        std::operator<<(local_1a8,"            ${JUCE_LIBS_LIBRARIES}\n");
      }
      if (local_468._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_468)
      {
        std::operator<<(local_1a8,"            ");
        get_libraries((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_450,this,&linuxLibs_abi_cxx11_);
        p_Var3 = (_List_node_base *)&local_450;
        while (p_Var3 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
              p_Var3 != (_List_node_base *)&local_450) {
          poVar2 = std::operator<<(local_1a8,(string *)(p_Var3 + 1));
          std::operator<<(poVar2," ");
        }
        std::__cxx11::
        _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_clear(&local_450);
        std::operator<<(local_1a8,"\n");
      }
      std::operator<<(local_1a8,"        )\n");
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear(&local_468);
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear(&local_480);
  }
  buildExport::~buildExport((buildExport *)local_418);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string project::get_linux_config()
{
    std::stringstream ss;

    project::buildExport b;
    get_export("LINUX_MAKE", b);
    if(!b.valid)
    {
        return "";
    }
    std::cout << "Using Linux Config" << std::endl;

    auto packages = get_libraries(linuxPackages);
    if(!packages.empty())
    {
        ss << "\n";
        ss << "        include(FindPkgConfig)\n";
        ss << "        pkg_check_modules(JUCE_LIBS REQUIRED\n";
        ss << "            ";
        for(auto const& package : packages)
        {
            ss << package << " ";
        }
        ss << "\n)\n";
    }
    if(!b.debug.headerPath.empty() || !packages.empty())
    {
        ss << "\n";
        ss << "        target_include_directories(" << name << " PUBLIC\n";
        if(!packages.empty())
        {
            ss << "            ${JUCE_LIBS_INCLUDE_DIRS}\n";
        }
        for(auto const& path : b.debug.headerPath)
        {
            ss << "            ${CMAKE_SYSROOT}/" << path << "\n";
        }
        ss << "        )\n";
    }
    if(!b.extraCompilerFlags.empty())
    {
        ss << "\n";
        ss << "        target_compile_options(" << name << " PUBLIC " << b.extraCompilerFlags << ")\n";
    }
    if(!b.debug.libraryPath.empty())
    {
        ss << "\n";
        ss << "        target_link_directories(" << name << " BEFORE PUBLIC\n";
        for(auto const& path : b.debug.libraryPath)
        {
            ss << "            ${CMAKE_SYSROOT}/" << path << "\n";
        }
        ss << "        )\n";
    }

    auto libs = get_libraries(linuxLibs);
    if(!b.externalLibraries.empty() || !packages.empty() || !libs.empty())
    {
        ss << "\n";
        ss << "        target_link_libraries(" << name << "\n";
        for(auto const& library : b.externalLibraries)
        {
            ss << "            " << library << "\n";
        }
        if(!packages.empty())
        {
            ss << "            ${JUCE_LIBS_LIBRARIES}\n";
        }
        if(!libs.empty())
        {
            ss << "            ";
            for(auto const& lib : get_libraries(linuxLibs))
            {
                ss << lib << " ";
            }
            ss << "\n";
        }
        ss << "        )\n";
    }

    return ss.str();
}